

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool __thiscall CGroupSubSys::parse(CGroupSubSys *this,string *line)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  char *__nptr;
  size_type sVar6;
  reference this_00;
  string local_a0;
  ulong local_80;
  size_t i;
  undefined1 local_68 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  size_t second;
  size_t first;
  string *line_local;
  CGroupSubSys *this_local;
  
  lVar3 = std::__cxx11::string::find((char)line,0x3a);
  if (lVar3 == -1) {
    this_local._7_1_ = false;
  }
  else {
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)line);
    *puVar4 = 0;
    lVar5 = std::__cxx11::string::find((char)line,0x3a);
    if (lVar5 == -1) {
      this_local._7_1_ = false;
    }
    else {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)line);
      *puVar4 = 0;
      __nptr = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(__nptr);
      this->id = iVar2;
      std::__cxx11::string::substr
                ((ulong)&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)line);
      std::__cxx11::string::operator=
                ((string *)&this->name,
                 (string *)
                 &pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      lVar5 = std::__cxx11::string::c_str();
      StringPiece::StringPiece((StringPiece *)&i,(char *)(lVar5 + lVar3 + 1));
      SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,_i,',');
      local_80 = 0;
      while( true ) {
        uVar1 = local_80;
        sVar6 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                          ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68);
        if (sVar6 <= uVar1) break;
        this_00 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,local_80)
        ;
        StringPiece::AsString_abi_cxx11_(&local_a0,this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->subsystems,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        local_80 = local_80 + 1;
      }
      this_local._7_1_ = true;
      std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
                ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool parse(string& line) {
    size_t first = line.find(':');
    if (first == string::npos)
      return false;
    line[first] = '\0';
    size_t second = line.find(':', first + 1);
    if (second == string::npos)
      return false;
    line[second] = '\0';
    id = atoi(line.c_str());
    name = line.substr(second + 1);
    vector<StringPiece> pieces =
        SplitStringPiece(StringPiece(line.c_str() + first + 1), ',');
    for (size_t i = 0; i < pieces.size(); i++) {
      subsystems.push_back(pieces[i].AsString());
    }
    return true;
  }